

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::EmitAddtlInfo_SnapArrayBufferInfo(SnapObject *snpObject,FileWriter *writer)

{
  SnapArrayBufferInfo *pSVar1;
  uint local_24;
  uint32 i;
  SnapArrayBufferInfo *buffInfo;
  FileWriter *writer_local;
  SnapObject *snpObject_local;
  
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapArrayBufferInfo*,(TTD::NSSnapObjects::SnapObjectType)23>
                     (snpObject);
  FileWriter::WriteLengthValue(writer,pSVar1->Length,CommaAndBigSpaceSeparator);
  if (pSVar1->Length != 0) {
    FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
    for (local_24 = 0; local_24 < pSVar1->Length; local_24 = local_24 + 1) {
      (*writer->_vptr_FileWriter[0xb])(writer,(ulong)pSVar1->Buff[local_24],(ulong)(local_24 != 0));
    }
    (*writer->_vptr_FileWriter[5])(writer,0);
  }
  return;
}

Assistant:

void EmitAddtlInfo_SnapArrayBufferInfo(const SnapObject* snpObject, FileWriter* writer)
        {
            SnapArrayBufferInfo* buffInfo = SnapObjectGetAddtlInfoAs<SnapArrayBufferInfo*, SnapObjectType::SnapArrayBufferObject>(snpObject);

            writer->WriteLengthValue(buffInfo->Length, NSTokens::Separator::CommaAndBigSpaceSeparator);

            if(buffInfo->Length > 0)
            {
                writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
                for(uint32 i = 0; i < buffInfo->Length; ++i)
                {
                    writer->WriteNakedByte(buffInfo->Buff[i], i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
                }
                writer->WriteSequenceEnd();
            }
        }